

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utilities.h
# Opt level: O1

int __thiscall libchess::Position::see_to(Position *this,Square square,array<int,_6UL> piece_values)

{
  uint *puVar1;
  PieceType piece_type;
  _Optional_payload<libchess::Square,_true,_true,_true> _Var2;
  ulong uVar3;
  ulong uVar4;
  pointer pcVar5;
  array<int,_6UL> piece_values_00;
  uint uVar6;
  int iVar7;
  Bitboard BVar8;
  undefined8 uVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  ulong unaff_RBP;
  array<int,_6UL> *paVar13;
  Position *pPVar14;
  value_type *pvVar15;
  int iVar16;
  bool bVar17;
  bool bVar18;
  byte bVar19;
  Position pos;
  undefined1 local_b8 [104];
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  bVar19 = 0;
  iVar16 = (this->side_to_move_).super_MetaValueType<int>.value_;
  uVar10 = this->color_bb_[iVar16].value_ &
           (&lookups::PAWN_ATTACKS)
           [(ulong)((long)iVar16 == 0) * 0x40 + (long)(int)square.super_MetaValueType<int>.value_] &
           this->piece_type_bb_[0].value_;
  if (uVar10 == 0) {
    lVar11 = 4;
LAB_00114ab6:
    piece_type.super_MetaValueType<int>.value_ =
         (MetaValueType<int>)
         ((MetaValueType<int> *)((long)&constants::PIECE_TYPES + lVar11))->value_;
    BVar8 = lookups::non_pawn_piece_type_attacks
                      (piece_type,square,this->color_bb_[1].value_ | this->color_bb_[0].value_);
    uVar10 = BVar8.value_ &
             this->color_bb_[(this->side_to_move_).super_MetaValueType<int>.value_].value_ &
             this->piece_type_bb_[(int)piece_type.super_MetaValueType<int>.value_].value_;
    if (uVar10 == 0) goto code_r0x00114adb;
    lVar11 = 0;
    if (uVar10 != 0) {
      for (; (uVar10 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
      }
    }
    uVar6 = (int)square.super_MetaValueType<int>.value_ << 6 | (uint)lVar11;
    goto LAB_00114b19;
  }
  lVar11 = 0;
  if (uVar10 != 0) {
    for (; (uVar10 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
    }
  }
  _Var2.super__Optional_payload_base<libchess::Square> =
       (this->history_).
       super__Vector_base<libchess::Position::State,_std::allocator<libchess::Position::State>_>.
       _M_impl.super__Vector_impl_data._M_start[this->ply_].enpassant_square_.
       super__Optional_base<libchess::Square,_true,_true>._M_payload.
       super__Optional_payload_base<libchess::Square>;
  if (_Var2.super__Optional_payload_base<libchess::Square>._M_payload ==
      (_Storage<libchess::Square,_true>)square.super_MetaValueType<int>.value_ &&
      ((ulong)_Var2.super__Optional_payload_base<libchess::Square> >> 0x20 & 1) != 0) {
    unaff_RBP = (ulong)((int)square.super_MetaValueType<int>.value_ << 6 | (uint)lVar11 | 0x18000);
  }
  else {
    iVar12 = 7 - ((int)square.super_MetaValueType<int>.value_ >> 3);
    if (iVar16 == 0) {
      iVar12 = (int)square.super_MetaValueType<int>.value_ >> 3;
    }
    uVar6 = (int)square.super_MetaValueType<int>.value_ << 6 | (uint)lVar11;
    if (iVar12 == 7) {
      unaff_RBP = (ulong)(uVar6 | 0x3c000);
    }
    else {
LAB_00114b19:
      unaff_RBP = (ulong)(uVar6 | 0x30000);
    }
  }
  bVar17 = true;
LAB_00114b21:
  if (!bVar17) {
    return 0;
  }
  uVar10 = 1L << ((byte)square.super_MetaValueType<int>.value_ & 0x3f);
  uVar6 = (value_type)unaff_RBP & 0x38000;
  lVar11 = 0;
  do {
    puVar1 = (uint *)((long)&constants::PIECE_TYPES + lVar11);
    uVar3 = this->piece_type_bb_[(int)*puVar1].value_;
    if ((uVar3 & uVar10) != 0) break;
    bVar17 = lVar11 != 0x14;
    lVar11 = lVar11 + 4;
  } while (bVar17);
  lVar11 = 0;
  do {
    uVar4 = this->color_bb_[*(int *)((long)&constants::COLORS + lVar11)].value_;
    if ((uVar4 & uVar10) != 0) break;
    bVar17 = lVar11 != 4;
    lVar11 = lVar11 + 4;
  } while (bVar17);
  bVar17 = (uVar4 & uVar10) != 0;
  bVar18 = (uVar3 & uVar10) != 0;
  if ((uVar6 != 0x18000) && (!bVar18 || !bVar17)) {
    return 0;
  }
  paVar13 = &piece_values;
  if (uVar6 != 0x18000) {
    uVar10 = 0;
    if (bVar18 && bVar17) {
      uVar10 = (ulong)(*puVar1 & 7);
    }
    if (5 < uVar10) goto LAB_00114cbe;
    paVar13 = (array<int,_6UL> *)((long)piece_values._M_elems + uVar10 * 4);
  }
  iVar16 = paVar13->_M_elems[0];
  uVar6 = (uint)(unaff_RBP >> 0xc) & 7;
  if (((unaff_RBP >> 0xc & 7) != 0) && (uVar6 != 5)) {
    uVar10 = (ulong)uVar6;
    if (5 < uVar6) {
LAB_00114cbe:
      uVar9 = std::__throw_out_of_range_fmt
                        ("array::at: __n (which is %zu) >= _Nm (which is %zu)",uVar10,6);
      ~Position((Position *)local_b8);
      _Unwind_Resume(uVar9);
    }
    iVar16 = (iVar16 + *(int *)((long)piece_values._M_elems + uVar10 * 4)) -
             piece_values._M_elems[0];
  }
  pPVar14 = this;
  pvVar15 = (value_type *)local_b8;
  for (lVar11 = 9; lVar11 != 0; lVar11 = lVar11 + -1) {
    *pvVar15 = pPVar14->piece_type_bb_[0].value_;
    pPVar14 = (Position *)((long)pPVar14 + (ulong)bVar19 * -0x10 + 8);
    pvVar15 = pvVar15 + (ulong)bVar19 * -2 + 1;
  }
  local_b8._72_4_ = this->ply_;
  std::vector<libchess::Position::State,_std::allocator<libchess::Position::State>_>::vector
            ((vector<libchess::Position::State,_std::allocator<libchess::Position::State>_> *)
             (local_b8 + 0x50),&this->history_);
  pcVar5 = (this->start_fen_)._M_dataplus._M_p;
  local_50._M_p = (pointer)&local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar5,pcVar5 + (this->start_fen_)._M_string_length);
  make_move((Position *)local_b8,(Move)(value_type)unaff_RBP);
  piece_values_00._M_elems[1] = piece_values._M_elems[1];
  piece_values_00._M_elems[0] = piece_values._M_elems[0];
  piece_values_00._M_elems[2] = piece_values._M_elems[2];
  piece_values_00._M_elems[3] = piece_values._M_elems[3];
  piece_values_00._M_elems[4] = piece_values._M_elems[4];
  piece_values_00._M_elems[5] = piece_values._M_elems[5];
  iVar7 = see_to((Position *)local_b8,square,piece_values_00);
  iVar12 = 0;
  if (0 < iVar16 - iVar7) {
    iVar12 = iVar16 - iVar7;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_p != &local_40) {
    operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
  }
  if ((pointer)local_b8._80_8_ != (pointer)0x0) {
    operator_delete((void *)local_b8._80_8_,local_b8._96_8_ - local_b8._80_8_);
    return iVar12;
  }
  return iVar12;
code_r0x00114adb:
  lVar11 = lVar11 + 4;
  if (lVar11 == 0x18) goto code_r0x00114ae5;
  goto LAB_00114ab6;
code_r0x00114ae5:
  bVar17 = false;
  goto LAB_00114b21;
}

Assistant:

inline int Position::see_to(Square square, std::array<int, 6> piece_values) {
    auto smallest_capture_move = smallest_capture_move_to(square);
    if (!smallest_capture_move) {
        return 0;
    }
    bool is_enpassant = smallest_capture_move->type() == Move::Type::ENPASSANT;

    auto square_pt = piece_on(square);
    if (!square_pt && !is_enpassant) {
        return 0;
    }

    int piece_val = is_enpassant ? piece_values.at(0) : piece_values.at(square_pt->type().value());
    auto smallest_capture_move_prom_piece_type = smallest_capture_move->promotion_piece_type();
    if (smallest_capture_move_prom_piece_type) {
        piece_val +=
            piece_values.at(smallest_capture_move_prom_piece_type->value()) - piece_values.at(0);
    }
    Position pos = *this;
    pos.make_move(*smallest_capture_move);
    return std::max(0, piece_val - pos.see_to(square, piece_values));
}